

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbtTriangleMeshShape::localGetSupportingVertex(cbtTriangleMeshShape *this,cbtVector3 *vec)

{
  undefined1 auVar1 [16];
  cbtVector3 cVar2;
  SupportVertexCallback supportCallback;
  cbtTransform ident;
  SupportVertexCallback local_c0;
  cbtTransform local_50;
  
  local_50.m_basis.m_el[0].m_floats[0] = 1.0;
  local_50.m_basis.m_el[0].m_floats[1] = 0.0;
  local_50.m_basis.m_el[0].m_floats[2] = 0.0;
  local_50.m_basis.m_el[0].m_floats[3] = 0.0;
  local_50.m_basis.m_el[1].m_floats[0] = 0.0;
  local_50.m_basis.m_el[1].m_floats[1] = 1.0;
  local_50.m_basis.m_el[1].m_floats[2] = 0.0;
  local_50.m_basis.m_el[1].m_floats[3] = 0.0;
  local_50.m_basis.m_el[2].m_floats[0] = 0.0;
  local_50.m_basis.m_el[2].m_floats[1] = 0.0;
  local_50.m_basis.m_el[2].m_floats[2] = 1.0;
  local_50.m_origin.m_floats[3] = 0.0;
  local_50.m_basis.m_el[2].m_floats[3] = 0.0;
  local_50.m_origin.m_floats[0] = 0.0;
  local_50.m_origin.m_floats[1] = 0.0;
  local_50.m_origin.m_floats[2] = 0.0;
  SupportVertexCallback::SupportVertexCallback(&local_c0,vec,&local_50);
  auVar1._8_4_ = 0xdd5e0b6b;
  auVar1._0_8_ = 0xdd5e0b6bdd5e0b6b;
  auVar1._12_4_ = 0xdd5e0b6b;
  vmovlhps_avx(auVar1,SUB6416(ZEXT464(0xdd5e0b6b),0));
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
            (this,&local_c0);
  cbtTriangleCallback::~cbtTriangleCallback(&local_c0.super_cbtTriangleCallback);
  cVar2.m_floats[2] = local_c0.m_supportVertexLocal.m_floats[2];
  cVar2.m_floats[3] = local_c0.m_supportVertexLocal.m_floats[3];
  cVar2.m_floats[0] = local_c0.m_supportVertexLocal.m_floats[0];
  cVar2.m_floats[1] = local_c0.m_supportVertexLocal.m_floats[1];
  return (cbtVector3)cVar2.m_floats;
}

Assistant:

cbtVector3 cbtTriangleMeshShape::localGetSupportingVertex(const cbtVector3& vec) const
{
	cbtVector3 supportVertex;

	cbtTransform ident;
	ident.setIdentity();

	SupportVertexCallback supportCallback(vec, ident);

	cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));

	processAllTriangles(&supportCallback, -aabbMax, aabbMax);

	supportVertex = supportCallback.GetSupportVertexLocal();

	return supportVertex;
}